

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_in.c
# Opt level: O2

gdImagePtr gdImageCreateFromGifCtx(gdIOCtxPtr fd)

{
  undefined2 uVar1;
  undefined2 uVar2;
  uchar uVar3;
  uchar uVar4;
  int iVar5;
  gdImagePtr im;
  ulong uVar6;
  byte bVar7;
  uchar (*cmap) [256];
  uint uVar8;
  uchar c;
  byte local_661;
  uint local_660;
  uint local_65c;
  uchar buf [16];
  int ZeroDataBlock;
  uchar localColorMap [3] [256];
  uchar ColorMap [3] [256];
  
  ZeroDataBlock = 0;
  iVar5 = gdGetBuf(buf,6,fd);
  if (iVar5 < 1) {
    return (gdImagePtr)0x0;
  }
  iVar5 = bcmp(buf,"GIF",3);
  if (iVar5 != 0) {
    return (gdImagePtr)0x0;
  }
  iVar5 = bcmp(buf + 3,"87a",3);
  if ((iVar5 != 0) && (iVar5 = bcmp(buf + 3,"89a",3), iVar5 != 0)) {
    return (gdImagePtr)0x0;
  }
  iVar5 = gdGetBuf(buf,7,fd);
  uVar2 = buf._2_2_;
  uVar1 = buf._0_2_;
  if (iVar5 < 1) {
    return (gdImagePtr)0x0;
  }
  uVar3 = buf[4];
  if (((char)buf[4] < '\0') && (iVar5 = ReadColorMap(fd,2 << (buf[4] & 7),ColorMap), iVar5 != 0)) {
    return (gdImagePtr)0x0;
  }
  local_660 = (uint)(ushort)uVar1;
  local_65c = 0xffffffff;
  while( true ) {
    iVar5 = gdGetBuf(&c,1,fd);
    if (iVar5 < 1) {
      return (gdImagePtr)0x0;
    }
    if (c == ';') {
      return (gdImagePtr)0x0;
    }
    if (c == ',') break;
    if (c == '!') {
      iVar5 = gdGetBuf(&c,1,fd);
      if (iVar5 < 1) {
        return (gdImagePtr)0x0;
      }
      if (c == 0xf9) {
        localColorMap[0][0] = '\0';
        localColorMap[0][1] = '\0';
        localColorMap[0][2] = '\0';
        localColorMap[0][3] = '\0';
        GetDataBlock(fd,localColorMap[0],&ZeroDataBlock);
        local_661 = localColorMap[0][0];
        uVar8 = (uint)localColorMap[0]._0_4_ >> 0x18;
        do {
          iVar5 = GetDataBlock(fd,localColorMap[0],&ZeroDataBlock);
        } while (0 < iVar5);
        if ((local_661 & 1) != 0) {
          local_65c = uVar8;
        }
      }
      else {
        do {
          iVar5 = GetDataBlock(fd,localColorMap[0],&ZeroDataBlock);
        } while (0 < iVar5);
      }
    }
  }
  iVar5 = gdGetBuf(buf,9,fd);
  if (iVar5 < 1) {
    return (gdImagePtr)0x0;
  }
  uVar4 = buf[8];
  bVar7 = buf[8] & 7;
  if (local_660 < (uint)(ushort)buf._0_2_ + (uint)(ushort)buf._4_2_) {
    return (gdImagePtr)0x0;
  }
  local_660 = (uint)(ushort)buf._6_2_;
  if ((uint)(ushort)uVar2 < (ushort)buf._2_2_ + local_660) {
    return (gdImagePtr)0x0;
  }
  im = gdImageCreate((uint)(ushort)buf._4_2_,(uint)(ushort)buf._6_2_);
  if (im == (gdImagePtr)0x0) {
    return (gdImagePtr)0x0;
  }
  uVar8 = (uint)buf._8_4_ >> 6 & 1;
  im->interlace = uVar8;
  if ((char)uVar4 < '\0') {
    iVar5 = ReadColorMap(fd,1 << bVar7 + 1,localColorMap);
    if (iVar5 != 0) goto LAB_0011618c;
    uVar8 = (uint)buf._8_4_ >> 6 & 1;
    cmap = localColorMap;
  }
  else {
    if (-1 < (char)uVar3) goto LAB_0011618c;
    cmap = ColorMap;
  }
  ReadImage(im,fd,(uint)(ushort)buf._4_2_,local_660,cmap,uVar8,&ZeroDataBlock);
  if (local_65c != 0xffffffff) {
    gdImageColorTransparent(im,local_65c);
  }
  uVar6 = (ulong)(uint)im->colorsTotal;
  if (uVar6 != 0) {
    while( true ) {
      if ((int)uVar6 < 1) {
        return im;
      }
      if (im->open[uVar6 - 1] == 0) break;
      uVar6 = uVar6 - 1;
      im->colorsTotal = (int)uVar6;
    }
    return im;
  }
LAB_0011618c:
  gdImageDestroy(im);
  return (gdImagePtr)0x0;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromGifCtx(gdIOCtxPtr fd)
{
	int BitPixel;
#if 0
	int ColorResolution;
	int Background;
	int AspectRatio;
#endif
	int Transparent = (-1);
	unsigned char buf[16];
	unsigned char c;
	unsigned char ColorMap[3][MAXCOLORMAPSIZE];
	unsigned char localColorMap[3][MAXCOLORMAPSIZE];
	int imw, imh, screen_width, screen_height;
	int useGlobalColormap;
	int bitPixel, i;
	/*1.4//int             imageCount = 0; */
	/* 2.0.28: threadsafe storage */
	int ZeroDataBlock = FALSE;
	int haveGlobalColormap;

	gdImagePtr im = 0;

	if(!ReadOK(fd, buf, 6)) {
		return 0;
	}

	if(strncmp((char *)buf, "GIF", 3) != 0) {
		return 0;
	}

	if(memcmp((char *)buf + 3, "87a", 3) == 0) {
		/* GIF87a */
	} else if(memcmp((char *)buf + 3, "89a", 3) == 0) {
		/* GIF89a */
	} else {
		return 0;
	}

	if(!ReadOK(fd, buf, 7)) {
		return 0;
	}

	BitPixel = 2 << (buf[4] & 0x07);
#if 0
	ColorResolution = (int) (((buf[4]&0x70)>>3)+1);
	Background = buf[5];
	AspectRatio = buf[6];
#endif
	screen_width = imw = LM_to_uint(buf[0], buf[1]);
	screen_height = imh = LM_to_uint(buf[2], buf[3]);

	haveGlobalColormap = BitSet(buf[4], LOCALCOLORMAP); /* Global Colormap */
	if(haveGlobalColormap) {
		if(ReadColorMap(fd, BitPixel, ColorMap)) {
			return 0;
		}
	}

	for (;;) {
		int top, left;
		int width, height;

		if(!ReadOK(fd, &c, 1)) {
			return 0;
		}

		if (c == ';') { /* GIF terminator */
			goto terminated;
		}

		if(c == '!') { /* Extension */
			if(!ReadOK(fd, &c, 1)) {
				return 0;
			}

			DoExtension(fd, c, &Transparent, &ZeroDataBlock);
			continue;
		}

		if(c != ',') { /* Not a valid start character */
			continue;
		}

		/*1.4//++imageCount; */

		if(!ReadOK(fd, buf, 9)) {
			return 0;
		}

		useGlobalColormap = !BitSet(buf[8], LOCALCOLORMAP);

		bitPixel = 1 << ((buf[8] & 0x07) + 1);
		left = LM_to_uint(buf[0], buf[1]);
		top = LM_to_uint(buf[2], buf[3]);
		width = LM_to_uint(buf[4], buf[5]);
		height = LM_to_uint(buf[6], buf[7]);

		if(((left + width) > screen_width) || ((top + height) > screen_height)) {
			if(VERBOSE) {
				printf("Frame is not confined to screen dimension.\n");
			}
			return 0;
		}

		if(!(im = gdImageCreate(width, height))) {
			return 0;
		}

		im->interlace = BitSet(buf[8], INTERLACE);
		if(!useGlobalColormap) {
			if(ReadColorMap(fd, bitPixel, localColorMap)) {
				gdImageDestroy(im);
				return 0;
			}

			ReadImage(im, fd, width, height, localColorMap, BitSet(buf[8], INTERLACE), &ZeroDataBlock);
		} else {
			if(!haveGlobalColormap) {
				gdImageDestroy(im);
				return 0;
			}

			ReadImage(im, fd, width, height, ColorMap, BitSet(buf[8], INTERLACE), &ZeroDataBlock);
		}

		if(Transparent != (-1)) {
			gdImageColorTransparent(im, Transparent);
		}

		goto terminated;
	}

terminated:
	/* Terminator before any image was declared! */
	if(!im) {
		return 0;
	}

	if(!im->colorsTotal) {
		gdImageDestroy(im);
		return 0;
	}

	/* Check for open colors at the end, so
	 * we can reduce colorsTotal and ultimately
	 * BitsPerPixel */
	for(i = im->colorsTotal - 1; i >= 0; i--) {
		if(im->open[i]) {
			im->colorsTotal--;
		} else {
			break;
		}
	}

	return im;
}